

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_creature_actor::state_read
          (cse_alife_creature_actor *this,xr_packet *packet,uint16_t size)

{
  uint16_t size_local;
  xr_packet *packet_local;
  cse_alife_creature_actor *this_local;
  
  if (*(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28 < 0x15) {
    xr_packet::r_u8(packet,&(this->super_cse_alife_creature_abstract).m_s_team);
    xr_packet::r_u8(packet,&(this->super_cse_alife_creature_abstract).m_s_squad);
    xr_packet::r_u8(packet,&(this->super_cse_alife_creature_abstract).m_s_group);
    if (0x12 < *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28) {
      xr_packet::r_float(packet,&(this->super_cse_alife_creature_abstract).m_health);
    }
    if (2 < *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28) {
      cse_visual::visual_read
                ((cse_visual *)&(this->super_cse_alife_creature_abstract).field_0x118,packet,
                 *(uint16_t *)&(this->super_cse_alife_creature_abstract).field_0x28);
    }
  }
  else {
    cse_alife_creature_abstract::state_read(&this->super_cse_alife_creature_abstract,packet,size);
    cse_alife_trader_abstract::state_read(&this->super_cse_alife_trader_abstract,packet,size);
    if (*(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28 < 0x20) {
      cse_visual::visual_read
                ((cse_visual *)&(this->super_cse_alife_creature_abstract).field_0x118,packet,
                 *(uint16_t *)&(this->super_cse_alife_creature_abstract).field_0x28);
    }
  }
  if (0x5b < *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28) {
    cse_ph_skeleton::state_read(&this->super_cse_ph_skeleton,packet,size);
  }
  if (0x58 < *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28) {
    xr_packet::r_u16(packet,&this->m_holder_id);
  }
  return;
}

Assistant:

void cse_alife_creature_actor::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version < CSE_VERSION_0x15) {
		packet.r_u8(m_s_team);
		packet.r_u8(m_s_squad);
		packet.r_u8(m_s_group);
		if (m_version > CSE_VERSION_0x12)
			packet.r_float(m_health);
		if (m_version >= CSE_VERSION_0x03)
			cse_visual::visual_read(packet, m_version);
	} else {
		cse_alife_creature_abstract::state_read(packet, size);
		cse_alife_trader_abstract::state_read(packet, size);
		if (m_version < CSE_VERSION_0x20)
			cse_visual::visual_read(packet, m_version);
	}
	if (m_version > CSE_VERSION_0x5b)
		cse_ph_skeleton::state_read(packet, size);
	if (m_version > CSE_VERSION_0x58)
		packet.r_u16(m_holder_id);
}